

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxs.cpp
# Opt level: O1

PAL_ERROR PAL_Enter(PAL_Boundary boundary)

{
  PAL_ERROR PVar1;
  CPalThread *in_RAX;
  CPalThread *local_28;
  CPalThread *pThread;
  
  local_28 = in_RAX;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_00333731;
  local_28 = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
  if (local_28 == (CPalThread *)0x0) {
    local_28 = CreateCurrentThreadData();
  }
  if (local_28 == (CPalThread *)0x0) {
    if (boundary != PAL_BoundaryTop) {
      fprintf(_stderr,"] %s %s:%d","PAL_Enter",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/init/sxs.cpp"
              ,0x41);
      fprintf(_stderr,
              "Expression: PAL_BoundaryTop == boundary, Description: How are we entering a PAL thread for the first time not from the top? (boundary=%u)"
              ,boundary);
    }
    PVar1 = AllocatePalThread(&local_28);
    if (PVar1 != 0) goto LAB_0033370f;
  }
  else if (local_28->m_fInPal == true) {
    PVar1 = 0;
LAB_0033370f:
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00333731;
  }
  else {
    local_28->m_fInPal = true;
    PVar1 = 0;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return PVar1;
  }
LAB_00333731:
  abort();
}

Assistant:

PAL_ERROR
PALAPI
PAL_Enter(PAL_Boundary boundary)
{
    ENTRY_EXTERNAL("PAL_Enter(boundary=%u)\n", boundary);

    PAL_ERROR palError = ERROR_SUCCESS;
    CPalThread *pThread = InternalGetCurrentThread();
    if (pThread != NULL)
    {
        palError = pThread->Enter(boundary);
    }
    else
    {
        // If this assert fires, we'll have to pipe this information so that
        // CPalThread's RunPostCreateInitializers call to SEHEnable
        // can know what direction.
        _ASSERT_MSG(PAL_BoundaryTop == boundary, "How are we entering a PAL "
            "thread for the first time not from the top? (boundary=%u)", boundary);

        palError = AllocatePalThread(&pThread);
        if (NO_ERROR != palError)
        {
            ERROR("Unable to allocate pal thread: error %d\n", palError);
        }
    }

    LOGEXIT("PAL_Enter returns %d\n", palError);
    return palError;
}